

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_File.cpp
# Opt level: O2

uint64_t axl::io::copyFile(File *srcFile,StringRef *dstFileName,uint64_t size)

{
  int iVar1;
  uint64_t uVar2;
  File dstFile;
  
  iVar1 = File::open(&dstFile,(char *)dstFileName,0);
  if ((char)iVar1 == '\0') {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    uVar2 = copyFile(srcFile,&dstFile,size);
  }
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&dstFile);
  return uVar2;
}

Assistant:

uint64_t
copyFile(
	const io::File* srcFile,
	const sl::StringRef& dstFileName,
	uint64_t size
) {
	File dstFile;
	bool result = dstFile.open(dstFileName);
	if (!result)
		return -1;

	return copyFile(srcFile, &dstFile, size);
}